

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O0

void __thiscall EmulateFunction::executeLoad(EmulateFunction *this)

{
  AddrSpace *val;
  int iVar1;
  uint4 ws;
  undefined4 extraout_var;
  Varnode *pVVar2;
  Address *addr;
  Address local_50;
  LoadTable local_40;
  int4 local_24;
  AddrSpace *pAStack_20;
  int4 sz;
  AddrSpace *spc;
  uintb off;
  EmulateFunction *this_local;
  
  off = (uintb)this;
  if ((this->collectloads & 1U) != 0) {
    PcodeOp::getIn((this->super_EmulatePcodeOp).currentOp,1);
    iVar1 = (*(this->super_EmulatePcodeOp).super_Emulate._vptr_Emulate[0x16])();
    spc = (AddrSpace *)CONCAT44(extraout_var,iVar1);
    pVVar2 = PcodeOp::getIn((this->super_EmulatePcodeOp).currentOp,0);
    addr = Varnode::getAddr(pVVar2);
    pAStack_20 = Address::getSpaceFromConst(addr);
    val = spc;
    ws = AddrSpace::getWordSize(pAStack_20);
    spc = (AddrSpace *)AddrSpace::addressToByte((uintb)val,ws);
    pVVar2 = PcodeOp::getOut((this->super_EmulatePcodeOp).currentOp);
    local_24 = Varnode::getSize(pVVar2);
    Address::Address(&local_50,pAStack_20,(uintb)spc);
    LoadTable::LoadTable(&local_40,&local_50,local_24);
    std::vector<LoadTable,_std::allocator<LoadTable>_>::push_back(&this->loadpoints,&local_40);
  }
  EmulatePcodeOp::executeLoad(&this->super_EmulatePcodeOp);
  return;
}

Assistant:

void EmulateFunction::executeLoad(void)

{
  if (collectloads) {
    uintb off = getVarnodeValue(currentOp->getIn(1));
    AddrSpace *spc = Address::getSpaceFromConst(currentOp->getIn(0)->getAddr());
    off = AddrSpace::addressToByte(off,spc->getWordSize());
    int4 sz = currentOp->getOut()->getSize();
    loadpoints.push_back(LoadTable(Address(spc,off),sz));
  }
  EmulatePcodeOp::executeLoad();
}